

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

int scmp(uchar *s1,uchar *s2)

{
  byte bVar1;
  byte *pbVar2;
  
  bVar1 = *s1;
  if (bVar1 != 0) {
    pbVar2 = s1 + 1;
    do {
      if (bVar1 != *s2) break;
      s2 = s2 + 1;
      bVar1 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar1 != 0);
  }
  return (uint)bVar1 - (uint)*s2;
}

Assistant:

int scmp( unsigned char *s1, unsigned char *s2 )
{
    while( *s1 != '\0' && *s1 == *s2 )
    {
        s1++;
        s2++;
    }
    return( *s1-*s2 );
}